

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

TanhLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_tanh(NeuralNetworkLayer *this)

{
  bool bVar1;
  Arena *arena;
  TanhLayerParams *pTVar2;
  NeuralNetworkLayer *this_local;
  
  bVar1 = _internal_has_tanh(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_tanh(this);
    arena = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
    pTVar2 = google::protobuf::MessageLite::
             CreateMaybeMessage<CoreML::Specification::TanhLayerParams>(arena);
    (this->layer_).tanh_ = pTVar2;
  }
  return (TanhLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::TanhLayerParams* NeuralNetworkLayer::_internal_mutable_tanh() {
  if (!_internal_has_tanh()) {
    clear_layer();
    set_has_tanh();
    layer_.tanh_ = CreateMaybeMessage< ::CoreML::Specification::TanhLayerParams >(GetArenaForAllocation());
  }
  return layer_.tanh_;
}